

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O2

void __thiscall
Clasp::Asp::PrgBody::PrgBody
          (PrgBody *this,uint32 id,LogicProgram *prg,LitSpan *lits,uint32 pos,bool addDeps)

{
  uint uVar1;
  int *piVar2;
  size_t sVar3;
  Literal *pLVar4;
  uint uVar5;
  long lVar6;
  Literal *p [2];
  
  PrgNode::PrgNode(&this->super_PrgNode,id,true);
  lVar6 = 0;
  init(this,(EVP_PKEY_CTX *)0x0);
  this->unsupp_ = pos;
  p[0] = (Literal *)(this + 1);
  p[1] = (Literal *)(&this[1].super_PrgNode.field_0x0 + (ulong)pos * 4);
  piVar2 = lits->first;
  sVar3 = lits->size;
  while( true ) {
    if (sVar3 << 2 == lVar6) {
      return;
    }
    uVar1 = *(uint *)((long)piVar2 + lVar6);
    if (uVar1 == 0) break;
    uVar5 = uVar1 * -4 + 2;
    if (-1 < (int)uVar1) {
      uVar5 = uVar1 * 4;
    }
    pLVar4 = p[uVar1 >> 0x1f];
    pLVar4->rep_ = uVar5;
    if (addDeps) {
      PrgAtom::addDep((prg->atoms_).ebo_.buf[uVar5 >> 2],id,(uVar5 & 2) == 0);
    }
    p[uVar1 >> 0x1f] = pLVar4 + 1;
    lVar6 = lVar6 + 4;
  }
  Potassco::fail(-2,
                 "Clasp::Asp::PrgBody::PrgBody(uint32, LogicProgram &, const Potassco::LitSpan &, uint32, bool)"
                 ,0x29f,"*it != 0","body not simplified",0);
}

Assistant:

PrgBody::PrgBody(uint32 id, LogicProgram& prg, const Potassco::LitSpan& lits, uint32 pos, bool addDeps)
	: PrgNode(id, true) {
	init(Body_t::Normal, toU32(Potassco::size(lits)));
	Norm* c = new (data_)Norm();
	unsupp_ = pos;
	// store B+ followed by B-
	Literal* p[2] = {c->lits, c->lits + pos};
	for (Potassco::LitSpan::iterator it = Potassco::begin(lits), end = Potassco::end(lits); it != end; ++it) {
		POTASSCO_REQUIRE(*it != 0, "body not simplified");
		Literal*& n = p[*it < 0];
		*n = toLit(*it);
		if (addDeps) { prg.getAtom(n->var())->addDep(id, !n->sign()); }
		++n;
	}
}